

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

int PAL_getc(PAL_FILE *f)

{
  int iVar1;
  int iVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (f == (PAL_FILE *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_getc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
              ,0x371);
      fprintf(_stderr,"Expression: f != NULL\n");
    }
    iVar1 = getc((FILE *)f->bsdFilePtr);
    if (iVar1 == 0xd && f->bTextMode != 0) {
      iVar2 = getc((FILE *)f->bsdFilePtr);
      iVar1 = 10;
      if (iVar2 != 10) {
        iVar2 = ungetc(iVar2,(FILE *)f->bsdFilePtr);
        iVar1 = 0xd;
        if ((iVar2 == -1) && (PAL_InitializeChakraCoreCalled == false)) goto LAB_00115d21;
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1;
    }
  }
LAB_00115d21:
  abort();
}

Assistant:

int
_cdecl
PAL_getc(PAL_FILE * f)
{
    INT nRetVal = 0;
    INT temp =0;

    PERF_ENTRY(getc);
    ENTRY( "getc( %p )\n", f );

    _ASSERTE(f != NULL);

    CLEARERR(f);

    nRetVal = getc( f->bsdFilePtr );

    if ( (f->bTextMode) && (nRetVal == '\r') )
    {
        if ((temp = getc( f->bsdFilePtr ))== '\n')
        {
            nRetVal ='\n';
        }
        else if (EOF == ungetc( temp, f->bsdFilePtr ))
        {
            ERROR("ungetc operation failed\n");
        }
    }

    LOGEXIT( "getc returning %d\n", nRetVal );
    PERF_EXIT(getc);
    return nRetVal;
}